

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantag.cpp
# Opt level: O3

string * __thiscall
YAML::ScanTagSuffix_abi_cxx11_(string *__return_storage_ptr__,YAML *this,Stream *INPUT)

{
  bool bVar1;
  int n;
  RegEx *this_00;
  Exception *this_01;
  string local_60;
  Mark local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = Stream::operator_cast_to_bool((Stream *)this);
    if (!bVar1) break;
    this_00 = Exp::Tag();
    local_60._M_dataplus._M_p = (pointer)0x0;
    local_60._M_string_length = (size_type)this;
    n = RegEx::Match<YAML::StreamCharSource>(this_00,(StreamCharSource *)&local_60);
    if (n < 1) break;
    Stream::get_abi_cxx11_(&local_60,(Stream *)this,n);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    return __return_storage_ptr__;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x40);
  local_40._0_8_ = *(undefined8 *)(this + 8);
  local_40.column = *(int *)(this + 0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"tag handle with no suffix","");
  Exception::Exception(this_01,&local_40,&local_60);
  *(undefined ***)this_01 = &PTR__BadFile_008779d0;
  __cxa_throw(this_01,&ParserException::typeinfo,BadFile::~BadFile);
}

Assistant:

const std::string ScanTagSuffix(Stream& INPUT) {
  std::string tag;

  while (INPUT) {
    int n = Exp::Tag().Match(INPUT);
    if (n <= 0)
      break;

    tag += INPUT.get(n);
  }

  if (tag.empty())
    throw ParserException(INPUT.mark(), ErrorMsg::TAG_WITH_NO_SUFFIX);

  return tag;
}